

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

lzma_ret delta_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  size_t sVar1;
  bool bVar2;
  size_t local_78;
  size_t out_start;
  size_t size;
  size_t out_avail;
  size_t in_avail;
  lzma_ret ret;
  lzma_delta_coder *coder;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
  if (*(long *)((long)coder_ptr + 0x18) == 0) {
    local_78 = out_size - *out_pos;
    if (in_size - *in_pos < local_78) {
      local_78 = in_size - *in_pos;
    }
    copy_and_encode((lzma_delta_coder *)coder_ptr,in + *in_pos,out + *out_pos,local_78);
    *in_pos = local_78 + *in_pos;
    *out_pos = local_78 + *out_pos;
    bVar2 = false;
    if (action != LZMA_RUN) {
      bVar2 = *in_pos == in_size;
    }
    in_avail._4_4_ = (lzma_ret)bVar2;
  }
  else {
    sVar1 = *out_pos;
    in_avail._4_4_ =
         (**(code **)((long)coder_ptr + 0x18))
                   (*coder_ptr,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    encode_in_place((lzma_delta_coder *)coder_ptr,out + sVar1,*out_pos - sVar1);
  }
  return in_avail._4_4_;
}

Assistant:

static lzma_ret
delta_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_delta_coder *coder = coder_ptr;

	lzma_ret ret;

	if (coder->next.code == NULL) {
		const size_t in_avail = in_size - *in_pos;
		const size_t out_avail = out_size - *out_pos;
		const size_t size = my_min(in_avail, out_avail);

		copy_and_encode(coder, in + *in_pos, out + *out_pos, size);

		*in_pos += size;
		*out_pos += size;

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		const size_t out_start = *out_pos;

		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		encode_in_place(coder, out + out_start, *out_pos - out_start);
	}

	return ret;
}